

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

QTextTable *
QTextTablePrivate::createTable
          (QTextDocumentPrivate *pieceTable,int pos,int rows,int cols,QTextTableFormat *tableFormat)

{
  long lVar1;
  int iVar2;
  int blockFormat;
  int iVar3;
  QObject *object;
  QTextObject *this;
  int i;
  int iVar4;
  long in_FS_OFFSET;
  QTextFormat local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::QTextFormat((QTextFormat *)local_48,(QTextFormat *)tableFormat);
  QTextTableFormat::setColumns((QTextTableFormat *)local_48,cols);
  object = &QTextDocumentPrivate::createObject(pieceTable,(QTextFormat *)local_48,-1)->super_QObject
  ;
  this = (QTextObject *)QtPrivate::qobject_cast_helper<QTextTable*,QObject>(object);
  QTextDocumentPrivate::beginEditBlock(pieceTable);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_58);
  iVar2 = QTextObject::objectIndex(this);
  QTextFormat::setObjectIndex((QTextFormat *)local_58,iVar2);
  QTextFormat::setObjectType((QTextFormat *)local_58,3);
  iVar2 = QTextFormatCollection::indexForFormat(&pieceTable->formats,(QTextFormat *)local_58);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_68);
  blockFormat = QTextFormatCollection::indexForFormat(&pieceTable->formats,&local_68);
  QTextFormat::~QTextFormat(&local_68);
  lVar1 = *(long *)&this->field_0x8;
  *(undefined1 *)(lVar1 + 0x109) = 1;
  iVar4 = 1;
  iVar3 = QTextDocumentPrivate::insertBlock
                    (pieceTable,(QChar)0xfdd0,pos,blockFormat,iVar2,MoveCursor);
  *(int *)(lVar1 + 0x84) = iVar3;
  QList<int>::append((QList<int> *)(lVar1 + 0xb8),iVar3);
  while( true ) {
    if (rows * cols <= iVar4) break;
    iVar3 = QTextDocumentPrivate::insertBlock
                      (pieceTable,(QChar)0xfdd0,pos + iVar4,blockFormat,iVar2,MoveCursor);
    QList<int>::append((QList<int> *)(lVar1 + 0xb8),iVar3);
    iVar4 = iVar4 + 1;
  }
  iVar2 = QTextDocumentPrivate::insertBlock
                    (pieceTable,(QChar)0xfdd1,pos + iVar4,blockFormat,iVar2,MoveCursor);
  *(int *)(lVar1 + 0x88) = iVar2;
  *(undefined2 *)(lVar1 + 0x108) = 1;
  QTextDocumentPrivate::endEditBlock(pieceTable);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QTextTable *)this;
  }
  __stack_chk_fail();
}

Assistant:

QTextTable *QTextTablePrivate::createTable(QTextDocumentPrivate *pieceTable, int pos, int rows, int cols, const QTextTableFormat &tableFormat)
{
    QTextTableFormat fmt = tableFormat;
    fmt.setColumns(cols);
    QTextTable *table = qobject_cast<QTextTable *>(pieceTable->createObject(fmt));
    Q_ASSERT(table);

    pieceTable->beginEditBlock();

//     qDebug("---> createTable: rows=%d, cols=%d at %d", rows, cols, pos);
    // add block after table
    QTextCharFormat charFmt;
    charFmt.setObjectIndex(table->objectIndex());
    charFmt.setObjectType(QTextFormat::TableCellObject);


    int charIdx = pieceTable->formatCollection()->indexForFormat(charFmt);
    int cellIdx = pieceTable->formatCollection()->indexForFormat(QTextBlockFormat());

    QTextTablePrivate *d = table->d_func();
    d->blockFragmentUpdates = true;

    d->fragment_start = pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx);
    d->cells.append(d->fragment_start);
    ++pos;

    for (int i = 1; i < rows*cols; ++i) {
        d->cells.append(pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx));
//      qDebug("      addCell at %d", pos);
        ++pos;
    }

    d->fragment_end = pieceTable->insertBlock(QTextEndOfFrame, pos, cellIdx, charIdx);
//  qDebug("      addEOR at %d", pos);
    ++pos;

    d->blockFragmentUpdates = false;
    d->dirty = true;

    pieceTable->endEditBlock();

    return table;
}